

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O3

void __thiscall
amrex::MLCellABecLap::getFluxes
          (MLCellABecLap *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Location a_loc)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double val;
  
  (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4c])();
  uVar1 = (ulong)(this->super_MLCellLinOp).super_MLLinOp.m_num_amr_levels;
  if (0 < (long)uVar1) {
    val = 1.0 / extraout_XMM0_Qa;
    lVar3 = 0;
    uVar4 = 0;
    do {
      (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x13])
                (this,uVar4 & 0xffffffff,
                 (a_flux->
                 super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                 ).
                 super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4,
                 (a_sol->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4],(ulong)a_loc);
      lVar5 = 3;
      lVar2 = lVar3;
      do {
        MLCellLinOp::unapplyMetricTerm
                  (&this->super_MLCellLinOp,(int)uVar4,0,
                   *(MultiFab **)
                    ((long)((a_flux->
                            super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2));
        if ((val != 1.0) || (NAN(val))) {
          MultiFab::mult(*(MultiFab **)
                          ((long)((a_flux->
                                  super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                                  ).
                                  super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2),val,
                         0);
        }
        lVar2 = lVar2 + 8;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 != uVar1);
  }
  return;
}

Assistant:

void
MLCellABecLap::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                          const Vector<MultiFab*>& a_sol,
                          Location a_loc) const
{
    BL_PROFILE("MLMG::getFluxes()");

    const Real betainv = Real(1.0) / getBScalar();
    const int nlevs = NAMRLevels();
    for (int alev = 0; alev < nlevs; ++alev) {
        compFlux(alev, a_flux[alev], *a_sol[alev], a_loc);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            unapplyMetricTerm(alev, 0, *a_flux[alev][idim]);
            if (betainv != Real(1.0)) {
                a_flux[alev][idim]->mult(betainv);
            }
        }
    }
}